

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::ScanLineInputFile::Data::readPixels(Data *this,FrameBuffer *fb,int scanLine1,int scanLine2)

{
  exr_chunk_info_t *peVar1;
  mutex *__mutex;
  undefined4 *__s;
  pointer this_00;
  uint uVar2;
  _func_exr_result_t__exr_decode_pipeline_ptr *p_Var3;
  __base_type _Var4;
  pointer pSVar5;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*> this_01;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aVar6;
  int iVar7;
  int iVar8;
  exr_result_t eVar9;
  __base_type _Var10;
  Task *this_02;
  ostream *poVar11;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aVar12;
  ScanLineProcess *pSVar13;
  InputExc *this_03;
  char *pcVar14;
  ArgExc *pAVar15;
  IoExc *pIVar16;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist;
  code *pcVar17;
  lock_guard<std::mutex> lock;
  ulong uVar18;
  ScanLineProcess *pSVar19;
  ScanLineProcess *__ptr;
  undefined *puVar20;
  pointer pSVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  exr_attr_box2i_t eVar25;
  int32_t scansperchunk;
  TaskGroup tg;
  exr_chunk_info_t cinfo;
  stringstream _iex_throw_s;
  undefined7 uStack_1b7;
  ostream local_1a8 [24];
  pointer local_190;
  pointer pSStack_188;
  pointer local_180;
  atomic<Imf_3_4::(anonymous_namespace)::ScanLineProcess_*> aStack_178;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_170;
  
  eVar25 = Context::dataWindow(this->_ctxt,this->partNumber);
  __ptr = (ScanLineProcess *)(ulong)(uint)this->partNumber;
  iVar7 = exr_get_scanlines_per_chunk
                    (*(this->_ctxt->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar7 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar11 = std::operator<<(local_1a8,"Error querying scanline counts from image file \"");
    pcVar14 = Context::fileName(this->_ctxt);
    poVar11 = std::operator<<(poVar11,pcVar14);
    std::operator<<(poVar11,"\".");
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pSVar19 = (ScanLineProcess *)(ulong)(uint)scanLine1;
  if (scanLine2 < scanLine1) {
    pSVar19 = (ScanLineProcess *)(ulong)(uint)scanLine2;
  }
  if (scanLine1 < scanLine2) {
    scanLine1 = scanLine2;
  }
  iVar7 = (int)pSVar19;
  if ((iVar7 < eVar25.min.y) || (eVar25.max.y < scanLine1)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar11 = std::operator<<(local_1a8,
                              "Tried to read scan line outside the image file\'s data window: ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,iVar7);
    poVar11 = std::operator<<(poVar11," - ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,scanLine1);
    poVar11 = std::operator<<(poVar11," vs datawindow ");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,eVar25.min.y);
    poVar11 = std::operator<<(poVar11," - ");
    std::ostream::operator<<((ostream *)poVar11,eVar25.max.y);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (0 < ((long)scanLine1 - (long)iVar7) / 1) {
    uVar2 = this->numThreads;
    uVar22 = (ulong)(int)uVar2;
    if (1 < (long)uVar22) {
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)&_iex_throw_s,uVar2);
      local_180 = (pointer)0x0;
      aStack_178._M_b._M_p = (__base_type)(__pointer_type)0x0;
      local_190 = (pointer)0x0;
      pSStack_188 = (pointer)0x0;
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      _Var10._M_p = (__pointer_type)operator_new(uVar22 * 0x248);
      for (uVar18 = 0; pSVar5 = pSStack_188, pSVar21 = local_190, uVar22 * 0x248 != uVar18;
          uVar18 = uVar18 + 0x248) {
        __s = (undefined4 *)((long)&(_Var10._M_p)->last_decode_err + uVar18);
        memset(__s,0,0x248);
        *__s = 0x21;
        *(undefined1 *)(__s + 1) = 1;
      }
      for (lVar23 = 0;
          this_00 = (pointer)((long)&(((_Vector_impl *)&pSVar21->last_decode_err)->
                                     super__Vector_impl_data)._M_start + lVar23), this_00 != pSVar5;
          lVar23 = lVar23 + 0x248) {
        memcpy((void *)((long)&(_Var10._M_p)->last_decode_err + lVar23),this_00,0x248);
        anon_unknown_6::ScanLineProcess::~ScanLineProcess((ScanLineProcess *)this_00);
      }
      std::
      _Vector_base<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      ::_M_deallocate((_Vector_base<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                       *)local_190,(pointer)(((long)local_180 - (long)local_190) / 0x248),
                      ((long)local_180 - (long)local_190) % 0x248);
      pSStack_188 = _Var10._M_p + uVar22;
      _Var4._M_p = _Var10._M_p;
      for (uVar18 = 0; uVar22 != uVar18; uVar18 = uVar18 + 1) {
        pSVar21 = _Var4._M_p + 1;
        if (uVar2 - 1 == uVar18) {
          pSVar21 = (pointer)0x0;
        }
        (_Var4._M_p)->next = pSVar21;
        _Var4._M_p = _Var4._M_p + 1;
      }
      LOCK();
      UNLOCK();
      local_190 = _Var10._M_p;
      local_180 = pSStack_188;
      aStack_178._M_b._M_p = (__base_type)(__base_type)_Var10._M_p;
      IlmThread_3_4::TaskGroup::TaskGroup(&tg);
      while ((int)pSVar19 <= scanLine1) {
        iVar7 = exr_read_scanline_chunk_info
                          (*(this->_ctxt->_ctxt).
                            super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,this->partNumber,pSVar19,&cinfo);
        if (iVar7 != 0) {
          this_03 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::InputExc::InputExc(this_03,"Unable to query scanline information");
          __cxa_throw(this_03,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
        }
        this_02 = (Task *)operator_new(0x38);
        IlmThread_3_4::Task::Task(this_02,&tg);
        *(undefined ***)this_02 = &PTR__LineBufferTask_001e4090;
        *(FrameBuffer **)(this_02 + 0x10) = fb;
        *(Data **)(this_02 + 0x18) = this;
        *(int *)(this_02 + 0x20) = (int)pSVar19;
        *(int *)(this_02 + 0x24) = scanLine1;
        IlmThread_3_4::Semaphore::wait();
        aVar12._M_b._M_p = aStack_178._M_b._M_p;
        do {
          _Var10 = aVar12._M_b._M_p;
          if (_Var10._M_p == (pointer)0x0) {
            poVar11 = std::operator<<((ostream *)&std::cerr,"GACK: serious failure case???");
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          LOCK();
          bVar24 = (__base_type)_Var10._M_p != aStack_178._M_b._M_p;
          aVar12._M_b._M_p = (__base_type)(__base_type)_Var10._M_p;
          aVar6._M_b._M_p = (__base_type)(__base_type)(_Var10._M_p)->next;
          if (bVar24) {
            aVar12._M_b._M_p = aStack_178._M_b._M_p;
            aVar6._M_b._M_p = aStack_178._M_b._M_p;
          }
          aStack_178._M_b._M_p = aVar6._M_b._M_p;
          UNLOCK();
        } while (bVar24);
        *(__pointer_type *)(this_02 + 0x28) = _Var10._M_p;
        *(stringstream **)(this_02 + 0x30) = &_iex_throw_s;
        ((_Var10._M_p)->cinfo).sample_count_data_offset = cinfo.sample_count_data_offset;
        ((_Var10._M_p)->cinfo).sample_count_table_size = cinfo.sample_count_table_size;
        ((_Var10._M_p)->cinfo).packed_size = cinfo.packed_size;
        ((_Var10._M_p)->cinfo).unpacked_size = cinfo.unpacked_size;
        ((_Var10._M_p)->cinfo).width = cinfo.width;
        ((_Var10._M_p)->cinfo).level_x = cinfo.level_x;
        ((_Var10._M_p)->cinfo).level_y = cinfo.level_y;
        ((_Var10._M_p)->cinfo).type = cinfo.type;
        ((_Var10._M_p)->cinfo).compression = cinfo.compression;
        ((_Var10._M_p)->cinfo).data_offset = cinfo.data_offset;
        ((_Var10._M_p)->cinfo).idx = cinfo.idx;
        ((_Var10._M_p)->cinfo).start_x = cinfo.start_x;
        ((_Var10._M_p)->cinfo).start_y = cinfo.start_y;
        ((_Var10._M_p)->cinfo).height = cinfo.height;
        IlmThread_3_4::ThreadPool::addGlobalTask(this_02);
        pSVar19 = (ScanLineProcess *)(ulong)(cinfo.start_y + 1);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup(&tg);
      this_01._M_b._M_p = local_170._M_b._M_p;
      LOCK();
      local_170._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      if (this_01._M_b._M_p == (__pointer_type)0x0) {
        IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::
        ~ProcessGroup((ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *)
                      &_iex_throw_s);
        return;
      }
      std::__cxx11::string::string((string *)&tg,(string *)this_01._M_b._M_p);
      std::__cxx11::string::~string((string *)this_01._M_b._M_p);
      operator_delete((void *)this_01._M_b._M_p,0x20);
      pIVar16 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar16,(string *)&tg);
      __cxa_throw(pIVar16,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  __mutex = &this->_mx;
  std::mutex::lock(__mutex);
  pSVar13 = (this->singleScan)._M_t.
            super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
            ._M_t.
            super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
            .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
            _M_head_impl;
  if (pSVar13 == (ScanLineProcess *)0x0) {
    pSVar13 = (ScanLineProcess *)operator_new(0x248);
    __ptr = (ScanLineProcess *)0x0;
    memset(pSVar13,0,0x248);
    pSVar13->last_decode_err = 0x21;
    pSVar13->first = true;
  }
  else {
    (this->singleScan)._M_t.
    super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
    .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl =
         (ScanLineProcess *)0x0;
  }
  __iex_throw_s = pSVar13;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar1 = &pSVar13->cinfo;
  while( true ) {
    iVar7 = (int)pSVar19;
    if (scanLine1 < iVar7) {
      std::mutex::lock(__mutex);
      pSVar13 = __iex_throw_s;
      _iex_throw_s = (stringstream)0x0;
      uStack_1b7 = 0;
      pSVar19 = (this->singleScan)._M_t.
                super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                ._M_t.
                super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>.
                _M_head_impl;
      (this->singleScan)._M_t.
      super___uniq_ptr_impl<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      ._M_t.
      super__Tuple_impl<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      .super__Head_base<0UL,_Imf_3_4::(anonymous_namespace)::ScanLineProcess_*,_false>._M_head_impl
           = pSVar13;
      if (pSVar19 != (ScanLineProcess *)0x0) {
        std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>::operator()
                  ((default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess> *)pSVar19,__ptr)
        ;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      std::
      unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
      ::~unique_ptr((unique_ptr<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::default_delete<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
                     *)&_iex_throw_s);
      return;
    }
    iVar8 = exr_read_scanline_chunk_info
                      (*(this->_ctxt->_ctxt).
                        super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       ,this->partNumber,pSVar19,&cinfo);
    if (iVar8 != 0) break;
    if (((pSVar13->first == false) && (peVar1->idx == cinfo.idx)) && (pSVar13->last_decode_err == 0)
       ) {
      filllist = (vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)(ulong)(uint)scanLine1;
      anon_unknown_6::ScanLineProcess::update_pointers(pSVar13,fb,iVar7,scanLine1);
      if (((pSVar13->decoder).chunk.unpacked_size != 0) &&
         (p_Var3 = (pSVar13->decoder).unpack_and_convert_fn,
         p_Var3 != (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0)) {
        eVar9 = (*p_Var3)(&pSVar13->decoder);
        pSVar13->last_decode_err = eVar9;
        if (eVar9 != 0) {
          pIVar16 = (IoExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::IoExc::IoExc(pIVar16,"Unable to run decoder");
          pcVar17 = Iex_3_4::IoExc::~IoExc;
          puVar20 = &Iex_3_4::IoExc::typeinfo;
          goto LAB_00197847;
        }
      }
      anon_unknown_6::ScanLineProcess::run_fill
                (pSVar13,(FrameBuffer *)pSVar19,(int)&this->fill_list,filllist);
      __ptr = pSVar19;
    }
    else {
      (pSVar13->cinfo).sample_count_data_offset = cinfo.sample_count_data_offset;
      (pSVar13->cinfo).sample_count_table_size = cinfo.sample_count_table_size;
      (pSVar13->cinfo).packed_size = cinfo.packed_size;
      (pSVar13->cinfo).unpacked_size = cinfo.unpacked_size;
      (pSVar13->cinfo).width = cinfo.width;
      (pSVar13->cinfo).level_x = cinfo.level_x;
      (pSVar13->cinfo).level_y = cinfo.level_y;
      (pSVar13->cinfo).type = cinfo.type;
      (pSVar13->cinfo).compression = cinfo.compression;
      (pSVar13->cinfo).data_offset = cinfo.data_offset;
      peVar1->idx = cinfo.idx;
      peVar1->start_x = cinfo.start_x;
      (pSVar13->cinfo).start_y = cinfo.start_y;
      (pSVar13->cinfo).height = cinfo.height;
      __ptr = (ScanLineProcess *)
              *(this->_ctxt->_ctxt).
               super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      anon_unknown_6::ScanLineProcess::run_decode
                (pSVar13,(exr_const_context_t)__ptr,this->partNumber,fb,iVar7,scanLine1,
                 &this->fill_list);
    }
    pSVar19 = (ScanLineProcess *)(ulong)(cinfo.start_y + 1);
  }
  pIVar16 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc((InputExc *)pIVar16,"Unable to query scanline information");
  pcVar17 = Iex_3_4::InputExc::~InputExc;
  puVar20 = &Iex_3_4::InputExc::typeinfo;
LAB_00197847:
  __cxa_throw(pIVar16,puVar20,pcVar17);
}

Assistant:

void ScanLineInputFile::Data::readPixels (
    const FrameBuffer &fb, int scanLine1, int scanLine2)
{
    exr_attr_box2i_t dw = _ctxt->dataWindow (partNumber);
    exr_chunk_info_t cinfo;
    int32_t          scansperchunk = 1;

    if (EXR_ERR_SUCCESS != exr_get_scanlines_per_chunk (*_ctxt, partNumber, &scansperchunk))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error querying scanline counts from image "
            "file \"" << _ctxt->fileName () << "\".");
    }

    if (scanLine2 < scanLine1)
        std::swap (scanLine1, scanLine2);

    if (scanLine1 < dw.min.y || scanLine2 > dw.max.y)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Tried to read scan line outside "
            "the image file's data window: "
            << scanLine1 << " - " << scanLine2
            << " vs datawindow "
            << dw.min.y << " - " << dw.max.y);
    }

#if ILMTHREAD_THREADING_ENABLED
    int64_t nchunks;
    nchunks = ((int64_t) scanLine2 - (int64_t) scanLine1);
    nchunks /= (int64_t) scansperchunk;
    nchunks += 1;

    if (nchunks > 1 && numThreads > 1)
    {
        // we need the lifetime of this to last longer than the
        // lifetime of the task group below such that we don't get use
        // after free type error, so use scope rules to accomplish
        // this
        ScanLineProcessGroup sg (numThreads);

        {
            ILMTHREAD_NAMESPACE::TaskGroup tg;

            for (int y = scanLine1; y <= scanLine2; )
            {
                if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                    throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

                ILMTHREAD_NAMESPACE::ThreadPool::addGlobalTask (
                    new LineBufferTask (&tg, this, &sg, &fb, cinfo, y, scanLine2) );

                y += scansperchunk - (y - cinfo.start_y);
            }
        }

        sg.throw_on_failure ();
    }
    else
#endif
    {
        std::unique_ptr<ScanLineProcess> sp = checkoutScan ();

        for (int y = scanLine1; y <= scanLine2; )
        {
            if (EXR_ERR_SUCCESS != exr_read_scanline_chunk_info (*_ctxt, partNumber, y, &cinfo))
                throw IEX_NAMESPACE::InputExc ("Unable to query scanline information");

            // check if we have the same chunk where we can just
            // re-run the unpack (i.e. people reading 1 scan at a time
            // in a multi-scanline chunk)
            if (!sp->first && sp->cinfo.idx == cinfo.idx &&
                sp->last_decode_err == EXR_ERR_SUCCESS)
            {
                sp->run_unpack (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }
            else
            {
                sp->cinfo = cinfo;
                sp->run_decode (
                    *_ctxt,
                    partNumber,
                    &fb,
                    y,
                    scanLine2,
                    fill_list);
            }

            y += scansperchunk - (y - cinfo.start_y);
        }

        checkinScan (sp);
    }
}